

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void FTransform_C(uint8_t *src,uint8_t *ref,int16_t *out)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int aiStack_78 [4];
  int aiStack_68 [4];
  int aiStack_58 [4];
  int aiStack_48 [2];
  int tmp [16];
  
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    iVar1 = ((uint)src[lVar3 * 2 + 3] - (uint)ref[lVar3 * 2 + 3]) +
            ((uint)src[lVar3 * 2] - (uint)ref[lVar3 * 2]);
    iVar2 = ((uint)src[lVar3 * 2 + 2] - (uint)ref[lVar3 * 2 + 2]) +
            ((uint)src[lVar3 * 2 + 1] - (uint)ref[lVar3 * 2 + 1]);
    iVar5 = ((uint)src[lVar3 * 2 + 1] - (uint)ref[lVar3 * 2 + 1]) -
            ((uint)src[lVar3 * 2 + 2] - (uint)ref[lVar3 * 2 + 2]);
    iVar4 = ((uint)src[lVar3 * 2] - (uint)ref[lVar3 * 2]) -
            ((uint)src[lVar3 * 2 + 3] - (uint)ref[lVar3 * 2 + 3]);
    *(int *)((long)aiStack_48 + lVar3) = (iVar1 + iVar2) * 8;
    *(int *)((long)tmp + lVar3 + -4) = iVar5 * 0x8a9 + iVar4 * 0x14e8 + 0x714 >> 9;
    *(int *)((long)tmp + lVar3) = (iVar1 - iVar2) * 8;
    *(int *)((long)tmp + lVar3 + 4) = iVar4 * 0x8a9 + iVar5 * -0x14e8 + 0x3a9 >> 9;
  }
  for (lVar3 = 0xc; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    iVar2 = aiStack_48[lVar3];
    iVar4 = aiStack_78[lVar3];
    iVar1 = aiStack_58[lVar3] + aiStack_68[lVar3];
    iVar5 = aiStack_68[lVar3] - aiStack_58[lVar3];
    iVar6 = iVar2 + iVar4 + 7;
    out[lVar3 + -0xc] = (int16_t)((uint)(iVar6 + iVar1) >> 4);
    iVar4 = iVar4 - iVar2;
    out[lVar3 + -8] =
         (ushort)(iVar4 != 0) + (short)((uint)(iVar4 * 0x14e8 + iVar5 * 0x8a9 + 12000) >> 0x10);
    out[lVar3 + -4] = (int16_t)((uint)(iVar6 - iVar1) >> 4);
    out[lVar3] = (int16_t)((uint)(iVar4 * 0x8a9 + iVar5 * -0x14e8 + 51000) >> 0x10);
  }
  return;
}

Assistant:

static void FTransform_C(const uint8_t* WEBP_RESTRICT src,
                         const uint8_t* WEBP_RESTRICT ref,
                         int16_t* WEBP_RESTRICT out) {
  int i;
  int tmp[16];
  for (i = 0; i < 4; ++i, src += BPS, ref += BPS) {
    const int d0 = src[0] - ref[0];   // 9bit dynamic range ([-255,255])
    const int d1 = src[1] - ref[1];
    const int d2 = src[2] - ref[2];
    const int d3 = src[3] - ref[3];
    const int a0 = (d0 + d3);         // 10b                      [-510,510]
    const int a1 = (d1 + d2);
    const int a2 = (d1 - d2);
    const int a3 = (d0 - d3);
    tmp[0 + i * 4] = (a0 + a1) * 8;   // 14b                      [-8160,8160]
    tmp[1 + i * 4] = (a2 * 2217 + a3 * 5352 + 1812) >> 9;      // [-7536,7542]
    tmp[2 + i * 4] = (a0 - a1) * 8;
    tmp[3 + i * 4] = (a3 * 2217 - a2 * 5352 +  937) >> 9;
  }
  for (i = 0; i < 4; ++i) {
    const int a0 = (tmp[0 + i] + tmp[12 + i]);  // 15b
    const int a1 = (tmp[4 + i] + tmp[ 8 + i]);
    const int a2 = (tmp[4 + i] - tmp[ 8 + i]);
    const int a3 = (tmp[0 + i] - tmp[12 + i]);
    out[0 + i] = (a0 + a1 + 7) >> 4;            // 12b
    out[4 + i] = ((a2 * 2217 + a3 * 5352 + 12000) >> 16) + (a3 != 0);
    out[8 + i] = (a0 - a1 + 7) >> 4;
    out[12+ i] = ((a3 * 2217 - a2 * 5352 + 51000) >> 16);
  }
}